

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O1

void __thiscall juzzlin::SimpleLogger::Impl::flushFileIfOpen(Impl *this)

{
  char cVar1;
  ostream *poVar2;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::__cxx11::stringbuf::str();
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)m_fileStream,(char *)local_30,local_28);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_30 != local_20) {
      operator_delete(local_30,local_20[0] + 1);
    }
    std::ostream::flush();
  }
  return;
}

Assistant:

void SimpleLogger::Impl::flushFileIfOpen()
{
    if (m_fileStream.is_open()) {
        m_fileStream << m_message.str() << std::endl;
        m_fileStream.flush();
    }
}